

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_specialspot.cpp
# Opt level: O0

bool __thiscall FSpotList::Add(FSpotList *this,ASpecialSpot *newspot)

{
  uint uVar1;
  ASpecialSpot **ppAVar2;
  uint local_24;
  ASpecialSpot *pAStack_20;
  uint i;
  ASpecialSpot *newspot_local;
  FSpotList *this_local;
  
  local_24 = 0;
  pAStack_20 = newspot;
  newspot_local = (ASpecialSpot *)this;
  while( true ) {
    uVar1 = TArray<ASpecialSpot_*,_ASpecialSpot_*>::Size(&this->Spots);
    if (uVar1 <= local_24) {
      TArray<ASpecialSpot_*,_ASpecialSpot_*>::Push(&this->Spots,&stack0xffffffffffffffe0);
      return true;
    }
    ppAVar2 = TArray<ASpecialSpot_*,_ASpecialSpot_*>::operator[](&this->Spots,(ulong)local_24);
    if (*ppAVar2 == pAStack_20) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

bool Add(ASpecialSpot *newspot)
	{
		for(unsigned i = 0; i < Spots.Size(); i++)
		{
			if (Spots[i] == newspot) return false;
		}
		Spots.Push(newspot);
		return true;
	}